

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O1

void __thiscall
TEST_MockHierarchyTest_EnableDisableWorkHierarchically_Test::testBody
          (TEST_MockHierarchyTest_EnableDisableWorkHierarchically_Test *this)

{
  uint uVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_38,"first");
  mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x21])(pMVar2);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"first");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"first");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])(pMVar2);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(ulong)(uVar1 & 0xff),
             "LONGS_EQUAL(0, mock(\"first\").expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
             ,0x42,pTVar4);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x22])(pMVar2);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"first");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"boo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_38,"first");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  uVar1 = (*pMVar2->_vptr_MockSupport[0x26])(pMVar2);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,(ulong)(uVar1 & 0xff),
             "LONGS_EQUAL(1, mock(\"first\").expectedCallsLeft()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
             ,0x46,pTVar4);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"first");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])(pMVar2);
  SimpleString::~SimpleString(&local_38);
  return;
}

Assistant:

TEST(MockHierarchyTest, EnableDisableWorkHierarchically)
{
    mock("first");

    mock().disable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(0, mock("first").expectedCallsLeft());

    mock().enable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(1, mock("first").expectedCallsLeft());

    mock("first").clear();
}